

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O1

Utest * __thiscall
TEST_DoublingFactorCounterTest_HalfFlush_Open_TestShell::createTest
          (TEST_DoublingFactorCounterTest_HalfFlush_Open_TestShell *this)

{
  TEST_DoublingFactorCounterTest_HalfFlush_Open_Test *this_00;
  
  this_00 = (TEST_DoublingFactorCounterTest_HalfFlush_Open_Test *)
            operator_new(0xc0,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                         ,0x27f);
  TEST_DoublingFactorCounterTest_HalfFlush_Open_Test::
  TEST_DoublingFactorCounterTest_HalfFlush_Open_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(DoublingFactorCounterTest, HalfFlush_Open)
{
	addPair(Tile::WhiteDragon);
	addTriplet(Tile::WestWind, true);
	addSequence(Tile::OneOfCharacters, false);
	addTriplet(Tile::FiveOfCharacters, false);
	addSequence(Tile::SixOfCharacters, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::HalfFlush));
	CHECK_EQUAL(2, r.doubling_factor);
}